

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O0

bool __thiscall
glu::SubTypeIterator<glu::IsBasicType>::operator!=
          (SubTypeIterator<glu::IsBasicType> *this,SubTypeIterator<glu::IsBasicType> *other)

{
  bool local_19;
  SubTypeIterator<glu::IsBasicType> *other_local;
  SubTypeIterator<glu::IsBasicType> *this_local;
  
  local_19 = true;
  if (this->m_type == other->m_type) {
    local_19 = std::operator!=(&this->m_path,&other->m_path);
  }
  return local_19;
}

Assistant:

bool								operator!=			(const SubTypeIterator<IsExpanded>& other) const { return m_type != other.m_type || m_path != other.m_path; }